

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_open,ImGuiTreeNodeFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  byte *in_RSI;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 button_center;
  float button_radius;
  ImGuiItemHoveredDataBackup last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  float in_stack_000000b4;
  ImVec2 *in_stack_000000b8;
  ImGuiID in_stack_000000c0;
  char *in_stack_00000128;
  char *in_stack_00000130;
  ImGuiTreeNodeFlags in_stack_0000013c;
  ImGuiID in_stack_00000140;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  float _y;
  float in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffffa0;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb0;
  bool local_1;
  
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    if ((in_RSI == (byte *)0x0) || ((*in_RSI & 1) != 0)) {
      ImGuiWindow::GetID((ImGuiWindow *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
      local_1 = TreeNodeBehavior(in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                                 in_stack_00000128);
      pIVar1 = GImGui;
      if (in_RSI != (byte *)0x0) {
        ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup
                  ((ImGuiItemHoveredDataBackup *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        fVar5 = pIVar1->FontSize;
        fVar4 = ImMin<float>((pIVar3->DC).LastItemRect.Max.x,(pIVar3->ClipRect).Max.x);
        fVar5 = (fVar4 - (pIVar1->Style).FramePadding.x) - fVar5 * 0.5;
        IVar6 = ImRect::GetCenter((ImRect *)CONCAT44(in_stack_ffffffffffffff8c,fVar5));
        fVar4 = IVar6.x;
        _y = IVar6.y;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,fVar5,_y);
        ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff94,_y),
                           (void *)CONCAT44(fVar4,fVar5));
        bVar2 = CloseButton(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
        if (bVar2) {
          *in_RSI = 0;
        }
        ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)&stack0xffffffffffffffa0);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_open, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_open && !*p_open)
        return false;

    ImGuiID id = window->GetID(label);
    bool is_open = TreeNodeBehavior(id, flags | ImGuiTreeNodeFlags_CollapsingHeader | (p_open ? ImGuiTreeNodeFlags_AllowItemOverlap : 0), label);
    if (p_open)
    {
        // Create a small overlapping close button // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        ImGuiContext& g = *GImGui;
        ImGuiItemHoveredDataBackup last_item_backup;
        float button_radius = g.FontSize * 0.5f;
        ImVec2 button_center = ImVec2(ImMin(window->DC.LastItemRect.Max.x, window->ClipRect.Max.x) - g.Style.FramePadding.x - button_radius, window->DC.LastItemRect.GetCenter().y);
        if (CloseButton(window->GetID((void*)((intptr_t)id+1)), button_center, button_radius))
            *p_open = false;
        last_item_backup.Restore();
    }

    return is_open;
}